

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::DMSegment::Dump(DMSegment *this,FILE *stream)

{
  char *pcVar1;
  undefined8 uVar2;
  char identbuf [128];
  char local_98 [128];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  pcVar1 = UL::EncodeString(&this->DataDefinition,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","DataDefinition",pcVar1);
  if ((this->Duration).m_has_value == true) {
    snprintf(local_98,0x40,"%lld",(this->Duration).m_property);
    fprintf((FILE *)stream,"  %22s = %s\n","Duration",local_98);
  }
  if ((this->EventStartPosition).m_has_value == true) {
    snprintf(local_98,0x40,"%lld",(this->EventStartPosition).m_property);
    fprintf((FILE *)stream,"  %22s = %s\n","EventStartPosition",local_98);
  }
  if ((this->EventComment).m_has_value == true) {
    pcVar1 = UTF16String::EncodeString(&(this->EventComment).m_property,local_98,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","EventComment",pcVar1);
  }
  uVar2 = Kumu::bin2UUIDhex((this->DMFramework).super_Identifier<16U>.m_Value,0x10,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","DMFramework",uVar2);
  return;
}

Assistant:

void
DMSegment::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "DataDefinition", DataDefinition.EncodeString(identbuf, IdentBufferLen));
  if ( ! Duration.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "Duration", i64sz(Duration.get(), identbuf));
  }
  if ( ! EventStartPosition.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "EventStartPosition", i64sz(EventStartPosition.get(), identbuf));
  }
  if ( ! EventComment.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "EventComment", EventComment.get().EncodeString(identbuf, IdentBufferLen));
  }
  fprintf(stream, "  %22s = %s\n",  "DMFramework", DMFramework.EncodeString(identbuf, IdentBufferLen));
}